

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

cni_holder_base *
cs_impl::cni::construct_helper<bool(*)(tm_const&)>::_construct<bool(&)(tm_const&),bool,tm_const&>
          (_func_bool_tm_ptr *val,_func_bool_tm_ptr *target_function)

{
  cni_holder<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)> *this;
  _func_bool_tm_ptr *local_18;
  
  this = (cni_holder<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)> *)operator_new(0x28);
  local_18 = val;
  cni_holder<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)>::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}